

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpg.c
# Opt level: O0

void skip_input_data(j_decompress_ptr cinfo,long num_bytes)

{
  long *plVar1;
  long in_RSI;
  long in_RDI;
  long skip;
  my_src_mgr *src;
  
  plVar1 = *(long **)(in_RDI + 0x28);
  if (plVar1[1] < in_RSI) {
    al_fseek(plVar1[8],in_RSI - plVar1[1],1);
    plVar1[1] = 0;
  }
  else {
    *plVar1 = in_RSI + *plVar1;
    plVar1[1] = plVar1[1] - in_RSI;
  }
  return;
}

Assistant:

static void skip_input_data(j_decompress_ptr cinfo, long num_bytes)
{
   struct my_src_mgr *src = (void *)cinfo->src;
   if (num_bytes <= (long)src->pub.bytes_in_buffer) {
      src->pub.next_input_byte += num_bytes;
      src->pub.bytes_in_buffer -= num_bytes;
   }
   else {
      long skip = num_bytes - src->pub.bytes_in_buffer;
      al_fseek(src->fp, skip, ALLEGRO_SEEK_CUR);
      src->pub.bytes_in_buffer = 0;
   }
}